

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
               (QWindow *args,QRect args_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined1 uVar4;
  long in_FS_OFFSET;
  QRect args_1_00;
  GeometryChangeEvent event;
  undefined1 local_78 [16];
  undefined1 *local_68;
  Data *pDStack_60;
  QObject *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QWindow *local_30 [2];
  long local_20;
  
  args_1_00._0_8_ = args_1._8_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30[0] = args_1._0_8_;
  local_30[1] = (QWindow *)args_1_00._0_8_;
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    args_1_00.x2.m_i = (int)in_RCX;
    args_1_00.y2.m_i = (int)((ulong)in_RCX >> 0x20);
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
              ((QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery> *)args,
               args_1._0_8_,args_1_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_002fd439;
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWindowSystemInterfacePrivate::GeometryChangeEvent::GeometryChangeEvent
            ((GeometryChangeEvent *)local_78,args,(QRect *)local_30);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_78);
LAB_002fd411:
    uVar4 = local_68._0_1_;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_78);
    if ((char)iVar3 != '\0') goto LAB_002fd411;
    uVar4 = 0;
  }
  QWindowSystemInterfacePrivate::GeometryChangeEvent::~GeometryChangeEvent
            ((GeometryChangeEvent *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar4;
  }
LAB_002fd439:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}